

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int xmlListSize(xmlListPtr l)

{
  int local_24;
  _xmlLink *p_Stack_20;
  int count;
  xmlLinkPtr lk;
  xmlListPtr l_local;
  
  local_24 = 0;
  if (l == (xmlListPtr)0x0) {
    l_local._4_4_ = -1;
  }
  else {
    for (p_Stack_20 = l->sentinel->next; p_Stack_20 != l->sentinel; p_Stack_20 = p_Stack_20->next) {
      local_24 = local_24 + 1;
    }
    l_local._4_4_ = local_24;
  }
  return l_local._4_4_;
}

Assistant:

int
xmlListSize(xmlListPtr l)
{
    xmlLinkPtr lk;
    int count=0;

    if (l == NULL)
        return(-1);
    /* TODO: keep a counter in xmlList instead */
    for(lk = l->sentinel->next; lk != l->sentinel; lk = lk->next, count++);
    return count;
}